

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::
ZLIBBufferCompressorTest_decompression_output_buffer_and_deflating_buffer_can_be_reused_Test::
TestBody(ZLIBBufferCompressorTest_decompression_output_buffer_and_deflating_buffer_can_be_reused_Test
         *this)

{
  string *lhs;
  __uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true> _Var1;
  long lVar2;
  char *pcVar3;
  AssertHelper AStack_358;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes2;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes1;
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  ByteBuffer compressed2;
  ByteBuffer decompressed2;
  ByteBuffer decompressed1;
  ZLIBBufferInflator decompressor2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278 [14];
  ZLIBBufferCompressor compressor2;
  char local_1f8 [152];
  ByteBuffer compressed1;
  ZLIBBufferInflator decompressor1;
  ZLIBBufferCompressor compressor1;
  
  bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(&compressor1,5);
  bidfx_public_api::tools::ZLIBBufferCompressor::Compress
            ((uchar *)&compressor1,
             (ulong)(this->super_ZLIBBufferCompressorTest).SMALL_TEXT._M_dataplus._M_p,0);
  bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(&decompressor1);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(&decompressed1);
  _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
  super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<const_char,_std::default_delete<const_char>_>)
       bidfx_public_api::tools::ByteBuffer::ToArray();
  decompressed_bytes1._M_t.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
  super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
       (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
       _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
       super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
       super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  _compressor2 = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&compressor2,
             _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
             super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
             super__Head_base<0UL,_const_char_*,_false>._M_head_impl,
             (long)_Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
                   super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar2);
  lhs = &(this->super_ZLIBBufferCompressorTest).SMALL_TEXT;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&decompressor2,"SMALL_TEXT",
             "std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes())",lhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compressor2);
  std::__cxx11::string::~string((string *)&compressor2);
  if (decompressor2 == (ZLIBBufferInflator)0x0) {
    testing::Message::Message((Message *)&compressor2);
    if (local_278[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_278[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&compressed2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&compressed2,(Message *)&compressor2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&compressed2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&compressor2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(local_278);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(local_278);
    bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(&compressor2,5);
    bidfx_public_api::tools::ZLIBBufferCompressor::Compress
              ((uchar *)&compressor2,
               (ulong)(this->super_ZLIBBufferCompressorTest).SMALL_TEXT._M_dataplus._M_p,0);
    bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
    bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(&decompressor2);
    bidfx_public_api::tools::ZLIBBufferInflator::Inflate(&decompressed2);
    _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
    super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<const_char,_std::default_delete<const_char>_>)
         bidfx_public_api::tools::ByteBuffer::ToArray();
    decompressed_bytes2._M_t.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>.
    _M_t.super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
         (__uniq_ptr_data<const_char,_std::default_delete<const_char>,_true,_true>)
         _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
         super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
         super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
    lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_330,
               _Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
               super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
               super__Head_base<0UL,_const_char_*,_false>._M_head_impl,
               (long)_Var1.super___uniq_ptr_impl<const_char,_std::default_delete<const_char>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_*,_std::default_delete<const_char>_>.
                     super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar2);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"SMALL_TEXT",
               "std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes())",lhs,
               &local_330);
    std::__cxx11::string::~string((string *)&local_330);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_330);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_358,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x107,pcVar3);
      testing::internal::AssertHelper::operator=(&AStack_358,(Message *)&local_330);
      testing::internal::AssertHelper::~AssertHelper(&AStack_358);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_330);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr(&decompressed_bytes2)
    ;
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&decompressed2);
    bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(&decompressor2);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&compressed2);
    bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(&compressor2);
  }
  std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr(&decompressed_bytes1);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&decompressed1);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(&decompressor1);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&compressed1);
  bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(&compressor1);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, decompression_output_buffer_and_deflating_buffer_can_be_reused)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &SMALL_TEXT[0], 0, SMALL_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(SMALL_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    ZLIBBufferCompressor compressor2 = ZLIBBufferCompressor(5);
    compressor2.Compress((unsigned char*) &SMALL_TEXT[0], 0, SMALL_TEXT.size());
    ByteBuffer compressed2 = compressor2.GetCompressed();

    ZLIBBufferInflator decompressor2;
    ByteBuffer decompressed2 = decompressor2.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(SMALL_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}